

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O0

void ImGui_ImplOpenGL3_RenderDrawData(ImDrawData *draw_data)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ImDrawList *pIVar3;
  ImDrawCmd *pIVar4;
  long in_RDI;
  ImVec4 clip_rect;
  ImDrawCmd *pcmd;
  int cmd_i;
  ImDrawList *cmd_list;
  int n;
  ImVec2 clip_scale;
  ImVec2 clip_off;
  GLuint vertex_array_object;
  GLboolean last_enable_scissor_test;
  GLboolean last_enable_depth_test;
  GLboolean last_enable_cull_face;
  GLboolean last_enable_blend;
  GLenum last_blend_equation_alpha;
  GLenum last_blend_equation_rgb;
  GLenum last_blend_dst_alpha;
  GLenum last_blend_src_alpha;
  GLenum last_blend_dst_rgb;
  GLenum last_blend_src_rgb;
  GLint last_scissor_box [4];
  GLint last_viewport [4];
  GLint last_polygon_mode [2];
  GLint last_vertex_array_object;
  GLint last_array_buffer;
  GLint last_sampler;
  GLint last_texture;
  GLint last_program;
  GLenum last_active_texture;
  int fb_height;
  int fb_width;
  float local_b8;
  float in_stack_ffffffffffffff4c;
  float in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  int local_9c;
  int local_8c;
  float local_88;
  float fStack_84;
  float local_80;
  float fStack_7c;
  GLuint local_78;
  GLboolean local_74;
  GLboolean local_73;
  GLboolean local_72;
  GLboolean local_71;
  GLenum local_70;
  GLenum local_6c;
  GLenum local_68;
  GLenum local_64;
  GLenum local_60;
  GLuint in_stack_ffffffffffffffa4;
  GLint in_stack_ffffffffffffffa8;
  GLint in_stack_ffffffffffffffac;
  GLsizei in_stack_ffffffffffffffb0;
  GLsizei in_stack_ffffffffffffffb4;
  GLint local_48;
  GLint local_44;
  GLsizei local_40;
  GLsizei local_3c;
  GLenum local_30 [2];
  GLuint local_28;
  GLuint local_24;
  GLuint local_20;
  GLuint local_1c;
  GLuint local_18;
  GLenum local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_c = (int)(*(float *)(in_RDI + 0x24) * *(float *)(in_RDI + 0x2c));
  local_10 = (int)(*(float *)(in_RDI + 0x28) * *(float *)(in_RDI + 0x30));
  if ((0 < local_c) && (0 < local_10)) {
    local_8 = in_RDI;
    (*gl3wGetIntegerv)(0x84e0,(GLint *)&local_14);
    (*gl3wActiveTexture)(0x84c0);
    (*gl3wGetIntegerv)(0x8b8d,(GLint *)&local_18);
    (*gl3wGetIntegerv)(0x8069,(GLint *)&local_1c);
    (*gl3wGetIntegerv)(0x8919,(GLint *)&local_20);
    (*gl3wGetIntegerv)(0x8894,(GLint *)&local_24);
    (*gl3wGetIntegerv)(0x85b5,(GLint *)&local_28);
    (*gl3wGetIntegerv)(0xb40,(GLint *)local_30);
    (*gl3wGetIntegerv)(0xba2,&local_48);
    (*gl3wGetIntegerv)(0xc10,(GLint *)&stack0xffffffffffffffa8);
    (*gl3wGetIntegerv)(0x80c9,(GLint *)&stack0xffffffffffffffa4);
    (*gl3wGetIntegerv)(0x80c8,(GLint *)&local_60);
    (*gl3wGetIntegerv)(0x80cb,(GLint *)&local_64);
    (*gl3wGetIntegerv)(0x80ca,(GLint *)&local_68);
    (*gl3wGetIntegerv)(0x8009,(GLint *)&local_6c);
    (*gl3wGetIntegerv)(0x883d,(GLint *)&local_70);
    local_71 = (*gl3wIsEnabled)(0xbe2);
    local_72 = (*gl3wIsEnabled)(0xb44);
    local_73 = (*gl3wIsEnabled)(0xb71);
    local_74 = (*gl3wIsEnabled)(0xc11);
    local_78 = 0;
    (*gl3wGenVertexArrays)(1,&local_78);
    ImGui_ImplOpenGL3_SetupRenderState
              ((ImDrawData *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
    uVar1 = *(undefined8 *)(local_8 + 0x1c);
    uVar2 = *(undefined8 *)(local_8 + 0x2c);
    for (local_8c = 0; local_8c < *(int *)(local_8 + 0x10); local_8c = local_8c + 1) {
      pIVar3 = *(ImDrawList **)(*(long *)(local_8 + 8) + (long)local_8c * 8);
      (*gl3wBufferData)(0x8892,(long)(pIVar3->VtxBuffer).Size * 0x14,(pIVar3->VtxBuffer).Data,0x88e0
                       );
      (*gl3wBufferData)(0x8893,(long)(pIVar3->IdxBuffer).Size << 2,(pIVar3->IdxBuffer).Data,0x88e0);
      for (local_9c = 0; local_9c < (pIVar3->CmdBuffer).Size; local_9c = local_9c + 1) {
        pIVar4 = ImVector<ImDrawCmd>::operator[]
                           ((ImVector<ImDrawCmd> *)
                            CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            (int)in_stack_ffffffffffffff4c);
        if (pIVar4->UserCallback == (ImDrawCallback)0x0) {
          ImVec4::ImVec4((ImVec4 *)&local_b8);
          local_80 = (float)uVar1;
          local_88 = (float)uVar2;
          local_b8 = ((pIVar4->ClipRect).x - local_80) * local_88;
          fStack_7c = (float)((ulong)uVar1 >> 0x20);
          fStack_84 = (float)((ulong)uVar2 >> 0x20);
          in_stack_ffffffffffffff4c = ((pIVar4->ClipRect).y - fStack_7c) * fStack_84;
          in_stack_ffffffffffffff50 = ((pIVar4->ClipRect).z - local_80) * local_88;
          in_stack_ffffffffffffff54 = ((pIVar4->ClipRect).w - fStack_7c) * fStack_84;
          if ((((local_b8 < (float)local_c) && (in_stack_ffffffffffffff4c < (float)local_10)) &&
              (0.0 <= in_stack_ffffffffffffff50)) && (0.0 <= in_stack_ffffffffffffff54)) {
            (*gl3wScissor)((int)local_b8,(int)((float)local_10 - in_stack_ffffffffffffff54),
                           (int)(in_stack_ffffffffffffff50 - local_b8),
                           (int)(in_stack_ffffffffffffff54 - in_stack_ffffffffffffff4c));
            (*gl3wBindTexture)(0xde1,(GLuint)pIVar4->TextureId);
            if (g_GlVersion < 0x140) {
              (*gl3wDrawElements)(4,pIVar4->ElemCount,0x1405,
                                  (GLvoid *)((ulong)pIVar4->IdxOffset << 2));
            }
            else {
              (*gl3wDrawElementsBaseVertex)
                        (4,pIVar4->ElemCount,0x1405,(GLvoid *)((ulong)pIVar4->IdxOffset << 2),
                         pIVar4->VtxOffset);
            }
          }
        }
        else if (pIVar4->UserCallback == (ImDrawCallback)0xffffffffffffffff) {
          ImGui_ImplOpenGL3_SetupRenderState
                    ((ImDrawData *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
        }
        else {
          (*pIVar4->UserCallback)(pIVar3,pIVar4);
        }
      }
    }
    (*gl3wDeleteVertexArrays)(1,&local_78);
    (*gl3wUseProgram)(local_18);
    (*gl3wBindTexture)(0xde1,local_1c);
    (*gl3wBindSampler)(0,local_20);
    (*gl3wActiveTexture)(local_14);
    (*gl3wBindVertexArray)(local_28);
    (*gl3wBindBuffer)(0x8892,local_24);
    (*gl3wBlendEquationSeparate)(local_6c,local_70);
    (*gl3wBlendFuncSeparate)(in_stack_ffffffffffffffa4,local_60,local_64,local_68);
    if (local_71 == '\0') {
      (*gl3wDisable)(0xbe2);
    }
    else {
      (*gl3wEnable)(0xbe2);
    }
    if (local_72 == '\0') {
      (*gl3wDisable)(0xb44);
    }
    else {
      (*gl3wEnable)(0xb44);
    }
    if (local_73 == '\0') {
      (*gl3wDisable)(0xb71);
    }
    else {
      (*gl3wEnable)(0xb71);
    }
    if (local_74 == '\0') {
      (*gl3wDisable)(0xc11);
    }
    else {
      (*gl3wEnable)(0xc11);
    }
    (*gl3wPolygonMode)(0x408,local_30[0]);
    (*gl3wViewport)(local_48,local_44,local_40,local_3c);
    (*gl3wScissor)(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffac,in_stack_ffffffffffffffb0,
                   in_stack_ffffffffffffffb4);
  }
  return;
}

Assistant:

void    ImGui_ImplOpenGL3_RenderDrawData(ImDrawData* draw_data)
{
    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates != framebuffer coordinates)
    int fb_width = (int)(draw_data->DisplaySize.x * draw_data->FramebufferScale.x);
    int fb_height = (int)(draw_data->DisplaySize.y * draw_data->FramebufferScale.y);
    if (fb_width <= 0 || fb_height <= 0)
        return;

    // Backup GL state
    GLenum last_active_texture; glGetIntegerv(GL_ACTIVE_TEXTURE, (GLint*)&last_active_texture);
    glActiveTexture(GL_TEXTURE0);
    GLint last_program; glGetIntegerv(GL_CURRENT_PROGRAM, &last_program);
    GLint last_texture; glGetIntegerv(GL_TEXTURE_BINDING_2D, &last_texture);
#ifdef GL_SAMPLER_BINDING
    GLint last_sampler; glGetIntegerv(GL_SAMPLER_BINDING, &last_sampler);
#endif
    GLint last_array_buffer; glGetIntegerv(GL_ARRAY_BUFFER_BINDING, &last_array_buffer);
#ifndef IMGUI_IMPL_OPENGL_ES2
    GLint last_vertex_array_object; glGetIntegerv(GL_VERTEX_ARRAY_BINDING, &last_vertex_array_object);
#endif
#ifdef GL_POLYGON_MODE
    GLint last_polygon_mode[2]; glGetIntegerv(GL_POLYGON_MODE, last_polygon_mode);
#endif
    GLint last_viewport[4]; glGetIntegerv(GL_VIEWPORT, last_viewport);
    GLint last_scissor_box[4]; glGetIntegerv(GL_SCISSOR_BOX, last_scissor_box);
    GLenum last_blend_src_rgb; glGetIntegerv(GL_BLEND_SRC_RGB, (GLint*)&last_blend_src_rgb);
    GLenum last_blend_dst_rgb; glGetIntegerv(GL_BLEND_DST_RGB, (GLint*)&last_blend_dst_rgb);
    GLenum last_blend_src_alpha; glGetIntegerv(GL_BLEND_SRC_ALPHA, (GLint*)&last_blend_src_alpha);
    GLenum last_blend_dst_alpha; glGetIntegerv(GL_BLEND_DST_ALPHA, (GLint*)&last_blend_dst_alpha);
    GLenum last_blend_equation_rgb; glGetIntegerv(GL_BLEND_EQUATION_RGB, (GLint*)&last_blend_equation_rgb);
    GLenum last_blend_equation_alpha; glGetIntegerv(GL_BLEND_EQUATION_ALPHA, (GLint*)&last_blend_equation_alpha);
    GLboolean last_enable_blend = glIsEnabled(GL_BLEND);
    GLboolean last_enable_cull_face = glIsEnabled(GL_CULL_FACE);
    GLboolean last_enable_depth_test = glIsEnabled(GL_DEPTH_TEST);
    GLboolean last_enable_scissor_test = glIsEnabled(GL_SCISSOR_TEST);

    // Setup desired GL state
    // Recreate the VAO every time (this is to easily allow multiple GL contexts to be rendered to. VAO are not shared among GL contexts)
    // The renderer would actually work without any VAO bound, but then our VertexAttrib calls would overwrite the default one currently bound.
    GLuint vertex_array_object = 0;
#ifndef IMGUI_IMPL_OPENGL_ES2
    glGenVertexArrays(1, &vertex_array_object);
#endif
    ImGui_ImplOpenGL3_SetupRenderState(draw_data, fb_width, fb_height, vertex_array_object);

    // Will project scissor/clipping rectangles into framebuffer space
    ImVec2 clip_off = draw_data->DisplayPos;         // (0,0) unless using multi-viewports
    ImVec2 clip_scale = draw_data->FramebufferScale; // (1,1) unless using retina display which are often (2,2)

    // Render command lists
    for (int n = 0; n < draw_data->CmdListsCount; n++)
    {
        const ImDrawList* cmd_list = draw_data->CmdLists[n];

        // Upload vertex/index buffers
        glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)cmd_list->VtxBuffer.Size * sizeof(ImDrawVert), (const GLvoid*)cmd_list->VtxBuffer.Data, GL_STREAM_DRAW);
        glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)cmd_list->IdxBuffer.Size * sizeof(ImDrawIdx), (const GLvoid*)cmd_list->IdxBuffer.Data, GL_STREAM_DRAW);

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            if (pcmd->UserCallback != NULL)
            {
                // User callback, registered via ImDrawList::AddCallback()
                // (ImDrawCallback_ResetRenderState is a special callback value used by the user to request the renderer to reset render state.)
                if (pcmd->UserCallback == ImDrawCallback_ResetRenderState)
                    ImGui_ImplOpenGL3_SetupRenderState(draw_data, fb_width, fb_height, vertex_array_object);
                else
                    pcmd->UserCallback(cmd_list, pcmd);
            }
            else
            {
                // Project scissor/clipping rectangles into framebuffer space
                ImVec4 clip_rect;
                clip_rect.x = (pcmd->ClipRect.x - clip_off.x) * clip_scale.x;
                clip_rect.y = (pcmd->ClipRect.y - clip_off.y) * clip_scale.y;
                clip_rect.z = (pcmd->ClipRect.z - clip_off.x) * clip_scale.x;
                clip_rect.w = (pcmd->ClipRect.w - clip_off.y) * clip_scale.y;

                if (clip_rect.x < fb_width && clip_rect.y < fb_height && clip_rect.z >= 0.0f && clip_rect.w >= 0.0f)
                {
                    // Apply scissor/clipping rectangle
                    glScissor((int)clip_rect.x, (int)(fb_height - clip_rect.w), (int)(clip_rect.z - clip_rect.x), (int)(clip_rect.w - clip_rect.y));

                    // Bind texture, Draw
                    glBindTexture(GL_TEXTURE_2D, (GLuint)(intptr_t)pcmd->TextureId);
#if IMGUI_IMPL_OPENGL_MAY_HAVE_VTX_OFFSET
                    if (g_GlVersion >= 320)
                        glDrawElementsBaseVertex(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, (void*)(intptr_t)(pcmd->IdxOffset * sizeof(ImDrawIdx)), (GLint)pcmd->VtxOffset);
                    else
#endif
                    glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, (void*)(intptr_t)(pcmd->IdxOffset * sizeof(ImDrawIdx)));
                }
            }
        }
    }

    // Destroy the temporary VAO
#ifndef IMGUI_IMPL_OPENGL_ES2
    glDeleteVertexArrays(1, &vertex_array_object);
#endif

    // Restore modified GL state
    glUseProgram(last_program);
    glBindTexture(GL_TEXTURE_2D, last_texture);
#ifdef GL_SAMPLER_BINDING
    glBindSampler(0, last_sampler);
#endif
    glActiveTexture(last_active_texture);
#ifndef IMGUI_IMPL_OPENGL_ES2
    glBindVertexArray(last_vertex_array_object);
#endif
    glBindBuffer(GL_ARRAY_BUFFER, last_array_buffer);
    glBlendEquationSeparate(last_blend_equation_rgb, last_blend_equation_alpha);
    glBlendFuncSeparate(last_blend_src_rgb, last_blend_dst_rgb, last_blend_src_alpha, last_blend_dst_alpha);
    if (last_enable_blend) glEnable(GL_BLEND); else glDisable(GL_BLEND);
    if (last_enable_cull_face) glEnable(GL_CULL_FACE); else glDisable(GL_CULL_FACE);
    if (last_enable_depth_test) glEnable(GL_DEPTH_TEST); else glDisable(GL_DEPTH_TEST);
    if (last_enable_scissor_test) glEnable(GL_SCISSOR_TEST); else glDisable(GL_SCISSOR_TEST);
#ifdef GL_POLYGON_MODE
    glPolygonMode(GL_FRONT_AND_BACK, (GLenum)last_polygon_mode[0]);
#endif
    glViewport(last_viewport[0], last_viewport[1], (GLsizei)last_viewport[2], (GLsizei)last_viewport[3]);
    glScissor(last_scissor_box[0], last_scissor_box[1], (GLsizei)last_scissor_box[2], (GLsizei)last_scissor_box[3]);
}